

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::TransformationParameter::ByteSizeLong(TransformationParameter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint32 value;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  string *value_00;
  int cached_size;
  size_t data_size;
  size_t sStack_38;
  uint count;
  size_t total_size;
  TransformationParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = TransformationParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = mean_value_size(this);
  iVar3 = mean_value_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_38 = (ulong)uVar2 * 4 + sVar4 + sStack_38;
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_mean_file(this);
    if (bVar1) {
      value_00 = mean_file_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_crop_size(this);
    if (bVar1) {
      value = crop_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(value);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_mirror(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_force_color(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_force_gray(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_scale(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t TransformationParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.TransformationParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float mean_value = 5;
  {
    unsigned int count = this->mean_value_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->mean_value_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional string mean_file = 4;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional uint32 crop_size = 3 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional bool mirror = 2 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool force_color = 6 [default = false];
    if (has_force_color()) {
      total_size += 1 + 1;
    }

    // optional bool force_gray = 7 [default = false];
    if (has_force_gray()) {
      total_size += 1 + 1;
    }

    // optional float scale = 1 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}